

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basisu_transcoder.cpp
# Opt level: O0

bool basist::compute_least_squares_endpoints_rgb
               (color32 *pColors,uint8_t *pSelectors,vec3F *pXl,vec3F *pXh)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  float *in_RCX;
  float *in_RDX;
  long in_RSI;
  long in_RDI;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  double dVar16;
  uint32_t i_1;
  uint32_t hi_v;
  uint32_t lo_v;
  uint32_t c;
  float iz11;
  float iz10;
  float iz01;
  float iz00;
  float det;
  float z01;
  float z11;
  float z10;
  float z00;
  float t_b;
  float q10_b;
  float q00_b;
  float t_g;
  float q10_g;
  float q00_g;
  float t_r;
  float q10_r;
  float q00_r;
  uint32_t sel;
  uint32_t b;
  uint32_t g;
  uint32_t r;
  uint32_t i;
  uint32_t weight_accum;
  uint32_t ut_b;
  uint32_t uq10_b;
  uint32_t uq00_b;
  uint32_t ut_g;
  uint32_t uq10_g;
  uint32_t uq00_g;
  uint32_t ut_r;
  uint32_t uq10_r;
  uint32_t uq00_r;
  uint local_bc;
  uint32_t local_b8;
  uint32_t local_b4;
  uint local_b0;
  uint local_54;
  uint local_50;
  uint local_4c;
  uint local_44;
  uint local_40;
  uint local_38;
  uint local_34;
  uint local_2c;
  bool local_1;
  
  local_2c = 0;
  local_34 = 0;
  local_38 = 0;
  local_40 = 0;
  local_44 = 0;
  local_4c = 0;
  local_50 = 0;
  for (local_54 = 0; local_54 < 0x10; local_54 = local_54 + 1) {
    uVar1 = (uint)*(byte *)(in_RDI + (ulong)local_54 * 4);
    uVar2 = (uint)*(byte *)(in_RDI + 1 + (ulong)local_54 * 4);
    uVar3 = (uint)*(byte *)(in_RDI + 2 + (ulong)local_54 * 4);
    uVar4 = (uint)*(byte *)(in_RSI + (ulong)local_54);
    local_34 = uVar1 + local_34;
    local_40 = uVar2 + local_40;
    local_4c = uVar3 + local_4c;
    local_50 = compute_least_squares_endpoints_rgb::s_weight_vals[uVar4] + local_50;
    local_2c = uVar4 * uVar1 + local_2c;
    local_38 = uVar4 * uVar2 + local_38;
    local_44 = uVar4 * uVar3 + local_44;
  }
  fVar5 = (float)local_2c;
  fVar6 = (float)local_38;
  fVar7 = (float)local_44;
  fVar8 = (float)local_34 * 3.0 - fVar5;
  fVar9 = (float)local_40 * 3.0 - fVar6;
  fVar10 = (float)local_4c * 3.0 - fVar7;
  fVar11 = (float)(local_50 >> 0x10 & 0xff);
  fVar12 = (float)(local_50 >> 8 & 0xff);
  fVar13 = fVar11 * (float)(local_50 & 0xff) - fVar12 * fVar12;
  dVar16 = std::fabs((double)(ulong)(uint)fVar13);
  if (1e-08 <= SUB84(dVar16,0)) {
    fVar13 = 3.0 / fVar13;
    fVar14 = (float)(local_50 & 0xff) * fVar13;
    fVar15 = -fVar12 * fVar13;
    fVar12 = -fVar12 * fVar13;
    fVar11 = fVar11 * fVar13;
    *in_RDX = fVar14 * fVar5 + fVar15 * fVar8;
    *in_RCX = fVar12 * fVar5 + fVar11 * fVar8;
    in_RDX[1] = fVar14 * fVar6 + fVar15 * fVar9;
    in_RCX[1] = fVar12 * fVar6 + fVar11 * fVar9;
    in_RDX[2] = fVar14 * fVar7 + fVar15 * fVar10;
    in_RCX[2] = fVar12 * fVar7 + fVar11 * fVar10;
    for (local_b0 = 0; local_b0 < 3; local_b0 = local_b0 + 1) {
      if ((in_RDX[local_b0] <= 0.0 && in_RDX[local_b0] != 0.0) || (255.0 < in_RCX[local_b0])) {
        local_b4 = 0xffffffff;
        local_b8 = 0;
        for (local_bc = 0; local_bc < 0x10; local_bc = local_bc + 1) {
          local_b4 = basisu::minimumu(local_b4,(uint)*(byte *)(in_RDI + (ulong)local_bc * 4 +
                                                              (ulong)local_b0));
          local_b8 = basisu::maximumu(local_b8,(uint)*(byte *)(in_RDI + (ulong)local_bc * 4 +
                                                              (ulong)local_b0));
        }
        if (local_b4 == local_b8) {
          in_RDX[local_b0] = (float)local_b4;
          in_RCX[local_b0] = (float)local_b8;
        }
      }
    }
    local_1 = true;
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

static bool compute_least_squares_endpoints_rgb(const color32* pColors, const uint8_t* pSelectors, vec3F* pXl, vec3F* pXh)
	{
		// Derived from bc7enc16's LS function.
		// Least squares using normal equations: http://www.cs.cornell.edu/~bindel/class/cs3220-s12/notes/lec10.pdf 
		// I did this in matrix form first, expanded out all the ops, then optimized it a bit.
		uint32_t uq00_r = 0, uq10_r = 0, ut_r = 0, uq00_g = 0, uq10_g = 0, ut_g = 0, uq00_b = 0, uq10_b = 0, ut_b = 0;

		// This table is: 9 * (w * w), 9 * ((1.0f - w) * w), 9 * ((1.0f - w) * (1.0f - w))
		// where w is [0,1/3,2/3,1]. 9 is the perfect multiplier.
		static const uint32_t s_weight_vals[4] = { 0x000009, 0x010204, 0x040201, 0x090000 };

		uint32_t weight_accum = 0;
		for (uint32_t i = 0; i < 16; i++)
		{
			const uint32_t r = pColors[i].c[0], g = pColors[i].c[1], b = pColors[i].c[2];
			const uint32_t sel = pSelectors[i];
			ut_r += r;
			ut_g += g;
			ut_b += b;
			weight_accum += s_weight_vals[sel];
			uq00_r += sel * r;
			uq00_g += sel * g;
			uq00_b += sel * b;
		}

		float q00_r = (float)uq00_r, q10_r = (float)uq10_r, t_r = (float)ut_r;
		float q00_g = (float)uq00_g, q10_g = (float)uq10_g, t_g = (float)ut_g;
		float q00_b = (float)uq00_b, q10_b = (float)uq10_b, t_b = (float)ut_b;

		q10_r = t_r * 3.0f - q00_r;
		q10_g = t_g * 3.0f - q00_g;
		q10_b = t_b * 3.0f - q00_b;

		float z00 = (float)((weight_accum >> 16) & 0xFF);
		float z10 = (float)((weight_accum >> 8) & 0xFF);
		float z11 = (float)(weight_accum & 0xFF);
		float z01 = z10;

		float det = z00 * z11 - z01 * z10;
		if (fabs(det) < 1e-8f)
			return false;

		det = 3.0f / det;

		float iz00, iz01, iz10, iz11;
		iz00 = z11 * det;
		iz01 = -z01 * det;
		iz10 = -z10 * det;
		iz11 = z00 * det;

		pXl->c[0] = iz00 * q00_r + iz01 * q10_r; pXh->c[0] = iz10 * q00_r + iz11 * q10_r;
		pXl->c[1] = iz00 * q00_g + iz01 * q10_g; pXh->c[1] = iz10 * q00_g + iz11 * q10_g;
		pXl->c[2] = iz00 * q00_b + iz01 * q10_b; pXh->c[2] = iz10 * q00_b + iz11 * q10_b;

		// Check and fix channel singularities - might not be needed, but is in UASTC's encoder.
		for (uint32_t c = 0; c < 3; c++)
		{
			if ((pXl->c[c] < 0.0f) || (pXh->c[c] > 255.0f))
			{
				uint32_t lo_v = UINT32_MAX, hi_v = 0;
				for (uint32_t i = 0; i < 16; i++)
				{
					lo_v = basisu::minimumu(lo_v, pColors[i].c[c]);
					hi_v = basisu::maximumu(hi_v, pColors[i].c[c]);
				}

				if (lo_v == hi_v)
				{
					pXl->c[c] = (float)lo_v;
					pXh->c[c] = (float)hi_v;
				}
			}
		}

		return true;
	}